

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCore.c
# Opt level: O2

int Lpk_ResynthesizeNodeNew(Lpk_Man_t *p)

{
  int *piVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  Vec_Ptr_t *p_00;
  int iVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  abctime aVar7;
  abctime aVar8;
  Abc_Obj_t *pAVar9;
  uint *pTruth;
  void *pvVar10;
  Lpk_Cut_t *pCut;
  int nCapMin;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  
  iVar4 = Abc_ObjRequiredLevel(p->pObj);
  aVar7 = Abc_Clock();
  iVar5 = Lpk_NodeCuts(p);
  aVar8 = Abc_Clock();
  p->timeCuts = p->timeCuts + (aVar8 - aVar7);
  if (iVar5 == 0) {
    iVar4 = 0;
  }
  else {
    if (p->pPars->fVeryVerbose != 0) {
      printf("Node %5d : Mffc size = %5d. Cuts = %5d.  Level = %2d. Req = %2d.\n",
             (ulong)(uint)p->pObj->Id,(ulong)(uint)p->nMffc,(ulong)(uint)p->nEvals,
             (ulong)(*(uint *)&p->pObj->field_0x14 >> 0xc),CONCAT44(extraout_var,iVar4));
    }
    iVar5 = p->nEvals;
    p->nCutsTotal = p->nCutsTotal + p->nCuts;
    p->nCutsUseful = p->nCutsUseful + iVar5;
    uVar11 = 0;
    while (((long)uVar11 < (long)iVar5 && ((uVar11 != 1 || (p->pPars->fFirst == 0))))) {
      pCut = p->pCuts + p->pEvals[uVar11];
      for (uVar13 = 0; uVar13 < (*(uint *)pCut & 0x3f); uVar13 = uVar13 + 1) {
        pAVar9 = Abc_NtkObj(p->pNtk,pCut->pLeaves[uVar13]);
        piVar1 = &(pAVar9->vFanouts).nSize;
        *piVar1 = *piVar1 + 1;
      }
      iVar5 = Abc_NodeMffcLabel(p->pObj);
      for (uVar13 = 0; uVar12 = *(uint *)pCut, uVar13 < (uVar12 & 0x3f); uVar13 = uVar13 + 1) {
        pAVar9 = Abc_NtkObj(p->pNtk,pCut->pLeaves[uVar13]);
        piVar1 = &(pAVar9->vFanouts).nSize;
        *piVar1 = *piVar1 + -1;
      }
      if (iVar5 == (uVar12 >> 6 & 0x3f) - (uVar12 >> 0xc & 0x3f)) {
        p->vLeaves->nSize = 0;
        for (uVar13 = 0; uVar13 < (*(uint *)pCut & 0x3f); uVar13 = uVar13 + 1) {
          p_00 = p->vLeaves;
          pAVar9 = Abc_NtkObj(p->pNtk,pCut->pLeaves[uVar13]);
          iVar5 = p_00->nSize;
          if (iVar5 == p_00->nCap) {
            nCapMin = iVar5 * 2;
            if (iVar5 < 0x10) {
              nCapMin = 0x10;
            }
            Vec_PtrGrow(p_00,nCapMin);
            iVar5 = p_00->nSize;
          }
          p_00->nSize = iVar5 + 1;
          p_00->pArray[iVar5] = pAVar9;
        }
        aVar7 = Abc_Clock();
        pTruth = Lpk_CutTruth(p,pCut,0);
        aVar8 = Abc_Clock();
        p->timeTruth = p->timeTruth + (aVar8 - aVar7);
        aVar7 = Abc_Clock();
        Lpk_ComputeSupports(p,pCut,pTruth);
        aVar8 = Abc_Clock();
        p->timeSupps = p->timeSupps + (aVar8 - aVar7);
        if (p->pPars->fVeryVerbose != 0) {
          uVar6 = Extra_TruthSupportSize(pTruth,*(uint *)pCut & 0x3f);
          uVar12 = *(uint *)pCut;
          printf("  C%02d: L= %2d/%2d  V= %2d/%d  N= %d  W= %4.2f  ",(double)pCut->Weight,
                 uVar11 & 0xffffffff,(ulong)(uVar12 & 0x3f),(ulong)uVar6,(ulong)(uVar12 >> 6 & 0x3f)
                 ,(ulong)(uVar12 >> 0xc & 0x3f),(ulong)(uVar12 >> 0x12 & 0x3f));
          for (iVar5 = 0; iVar5 < p->vLeaves->nSize; iVar5 = iVar5 + 1) {
            pvVar10 = Vec_PtrEntry(p->vLeaves,iVar5);
            printf("%c=%d ",(ulong)(iVar5 + 0x61),(ulong)(*(uint *)((long)pvVar10 + 0x14) >> 0xc));
          }
          putchar(10);
          Kit_DsdPrintFromTruth(pTruth,*(uint *)pCut & 0x3f);
        }
        iVar5 = p->pNtk->nObjCounts[7];
        aVar7 = Abc_Clock();
        pAVar9 = Lpk_Decompose(p,p->pNtk,p->vLeaves,pTruth,p->puSupps,p->pPars->nLutSize,
                               (uint)(0 < p->pPars->fZeroCost) +
                               (~*(uint *)pCut >> 0xc | 0xffffffc0) + (*(uint *)pCut >> 6 & 0x3f),
                               iVar4);
        aVar8 = Abc_Clock();
        p->timeEval = p->timeEval + (aVar8 - aVar7);
        if (pAVar9 != (Abc_Obj_t *)0x0) {
          uVar12 = (iVar5 - p->pNtk->nObjCounts[7]) +
                   ((*(uint *)pCut >> 6 & 0x3f) - (*(uint *)pCut >> 0xc & 0x3f));
          if ((int)uVar12 < 1 - p->pPars->fZeroCost) {
            __assert_fail("nGain >= 1 - p->pPars->fZeroCost",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCore.c"
                          ,0x1d6,"int Lpk_ResynthesizeNodeNew(Lpk_Man_t *)");
          }
          if ((int)(*(uint *)&pAVar9->field_0x14 >> 0xc) <= iVar4) {
            uVar2 = p->nGainTotal;
            uVar3 = p->nChanges;
            p->nGainTotal = uVar12 + uVar2;
            p->nChanges = uVar3 + 1;
            if (p->pPars->fVeryVerbose != 0) {
              printf("Performed resynthesis: Gain = %2d. Level = %2d. Req = %2d.\n",(ulong)uVar12,
                     (ulong)(*(uint *)&pAVar9->field_0x14 >> 0xc),CONCAT44(extraout_var,iVar4));
            }
            Abc_NtkUpdate(p->pObj,pAVar9,p->vLevels);
            return 1;
          }
          __assert_fail("Abc_ObjLevel(pObjNew) <= Required",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCore.c"
                        ,0x1d7,"int Lpk_ResynthesizeNodeNew(Lpk_Man_t *)");
        }
      }
      uVar11 = uVar11 + 1;
      iVar5 = p->nEvals;
    }
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int Lpk_ResynthesizeNodeNew( Lpk_Man_t * p )
{
//    static int Count = 0;
    Abc_Obj_t * pObjNew, * pLeaf;
    Lpk_Cut_t * pCut;
    unsigned * pTruth;
    int nNodesBef, nNodesAft, nCutNodes;
    int i, k;
    abctime clk;
    int Required = Abc_ObjRequiredLevel(p->pObj);
//    CloudNode * pFun2;//, * pFun1;

    // compute the cuts
clk = Abc_Clock();
    if ( !Lpk_NodeCuts( p ) )
    {
p->timeCuts += Abc_Clock() - clk;
        return 0;
    }
p->timeCuts += Abc_Clock() - clk;

    if ( p->pPars->fVeryVerbose )
        printf( "Node %5d : Mffc size = %5d. Cuts = %5d.  Level = %2d. Req = %2d.\n", 
            p->pObj->Id, p->nMffc, p->nEvals, p->pObj->Level, Required );
    // try the good cuts
    p->nCutsTotal  += p->nCuts;
    p->nCutsUseful += p->nEvals;
    for ( i = 0; i < p->nEvals; i++ )
    {
        // get the cut
        pCut = p->pCuts + p->pEvals[i];
        if ( p->pPars->fFirst && i == 1 )
            break;
//        if ( pCut->Weight < 1.05 )
//            continue;

        // skip bad cuts        
//        printf( "Mffc size = %d.  ", Abc_NodeMffcLabel(p->pObj) );
        for ( k = 0; k < (int)pCut->nLeaves; k++ )
            Abc_NtkObj(p->pNtk, pCut->pLeaves[k])->vFanouts.nSize++;
        nCutNodes = Abc_NodeMffcLabel(p->pObj);
//        printf( "Mffc with cut = %d.  ", nCutNodes );
        for ( k = 0; k < (int)pCut->nLeaves; k++ )
            Abc_NtkObj(p->pNtk, pCut->pLeaves[k])->vFanouts.nSize--;
//        printf( "Mffc cut = %d.  ", (int)pCut->nNodes - (int)pCut->nNodesDup );
//        printf( "\n" );
        if ( nCutNodes != (int)pCut->nNodes - (int)pCut->nNodesDup )
            continue;

        // collect nodes into the array
        Vec_PtrClear( p->vLeaves );
        for ( k = 0; k < (int)pCut->nLeaves; k++ )
            Vec_PtrPush( p->vLeaves, Abc_NtkObj(p->pNtk, pCut->pLeaves[k]) );

        // compute the truth table
clk = Abc_Clock();
        pTruth = Lpk_CutTruth( p, pCut, 0 );
p->timeTruth += Abc_Clock() - clk;
clk = Abc_Clock();
        Lpk_ComputeSupports( p, pCut, pTruth );        
p->timeSupps += Abc_Clock() - clk;
//clk = Abc_Clock();
//        pFun1 = Lpk_CutTruthBdd( p, pCut );
//p->timeTruth2 += Abc_Clock() - clk;
/*
clk = Abc_Clock();
        Cloud_Restart( p->pDsdMan->dd );
        pFun2 = Kit_TruthToCloud( p->pDsdMan->dd, pTruth, pCut->nLeaves );
        RetValue = Kit_CreateCloud( p->pDsdMan->dd, pFun2, p->vBddNodes );
p->timeTruth3 += Abc_Clock() - clk;
*/
//        if ( pFun1 != pFun2 )
//            printf( "Truth tables do not agree!\n" );
//        else
//            printf( "Fine!\n" );

        if ( p->pPars->fVeryVerbose )
        {
//            char * pFileName;
            int nSuppSize = Extra_TruthSupportSize( pTruth, pCut->nLeaves );
            printf( "  C%02d: L= %2d/%2d  V= %2d/%d  N= %d  W= %4.2f  ", 
                i, pCut->nLeaves, nSuppSize, pCut->nNodes, pCut->nNodesDup, pCut->nLuts, pCut->Weight );
            Vec_PtrForEachEntry( Abc_Obj_t *, p->vLeaves, pLeaf, k )
                printf( "%c=%d ", 'a'+k, Abc_ObjLevel(pLeaf) );
            printf( "\n" );
            Kit_DsdPrintFromTruth( pTruth, pCut->nLeaves );
//            pFileName = Kit_TruthDumpToFile( pTruth, pCut->nLeaves, Count++ );
//            printf( "Saved truth table in file \"%s\".\n", pFileName );
        }

        // update the network
        nNodesBef = Abc_NtkNodeNum(p->pNtk);
clk = Abc_Clock();
        pObjNew = Lpk_Decompose( p, p->pNtk, p->vLeaves, pTruth, p->puSupps, p->pPars->nLutSize,
            (int)pCut->nNodes - (int)pCut->nNodesDup - 1 + (int)(p->pPars->fZeroCost > 0), Required );
p->timeEval += Abc_Clock() - clk;
        nNodesAft = Abc_NtkNodeNum(p->pNtk);

        // perform replacement
        if ( pObjNew )
        {
            int nGain = (int)pCut->nNodes - (int)pCut->nNodesDup - (nNodesAft - nNodesBef);
            assert( nGain >= 1 - p->pPars->fZeroCost );
            assert( Abc_ObjLevel(pObjNew) <= Required );
/*
            if ( nGain <= 0 )
            {
                int x = 0;
            }
            if ( Abc_ObjLevel(pObjNew) > Required )
            {
                int x = 0;
            }
*/
            p->nGainTotal += nGain;
            p->nChanges++;
            if ( p->pPars->fVeryVerbose )
                printf( "Performed resynthesis: Gain = %2d. Level = %2d. Req = %2d.\n", nGain, Abc_ObjLevel(pObjNew), Required );
            Abc_NtkUpdate( p->pObj, pObjNew, p->vLevels );
//printf( "%3d : %d-%d=%d(%d) \n", p->nChanges, nNodesBef, Abc_NtkNodeNum(p->pNtk), nNodesBef-Abc_NtkNodeNum(p->pNtk), nGain );
            break;
        }
    }
    return 1;
}